

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.c
# Opt level: O0

void ParseInit(void *yypRawParser)

{
  yyParser *yypParser;
  void *yypRawParser_local;
  
  *(undefined4 *)((long)yypRawParser + 8) = 0xffffffff;
  *(long *)yypRawParser = (long)yypRawParser + 0x18;
  *(undefined1 *)((long)yypRawParser + 0x18) = 0;
  *(undefined1 *)((long)yypRawParser + 0x19) = 0;
  *(long *)((long)yypRawParser + 0x658) = (long)yypRawParser + 0x648;
  return;
}

Assistant:

void ParseInit(void *yypRawParser ParseCTX_PDECL){
  yyParser *yypParser = (yyParser*)yypRawParser;
  ParseCTX_STORE
#ifdef YYTRACKMAXSTACKDEPTH
  yypParser->yyhwm = 0;
#endif
#if YYSTACKDEPTH<=0
  yypParser->yytos = NULL;
  yypParser->yystack = NULL;
  yypParser->yystksz = 0;
  if( yyGrowStack(yypParser) ){
    yypParser->yystack = &yypParser->yystk0;
    yypParser->yystksz = 1;
  }
#endif
#ifndef YYNOERRORRECOVERY
  yypParser->yyerrcnt = -1;
#endif
  yypParser->yytos = yypParser->yystack;
  yypParser->yystack[0].stateno = 0;
  yypParser->yystack[0].major = 0;
#if YYSTACKDEPTH>0
  yypParser->yystackEnd = &yypParser->yystack[YYSTACKDEPTH-1];
#endif
}